

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O2

void __thiscall mocker::ir::Builder::operator()(Builder *this)

{
  IfStmt *in_RSI;
  
  operator()((Builder *)(&this->field_0x0 + *(long *)(*(long *)this + -0xb0)),in_RSI);
  return;
}

Assistant:

void Builder::operator()(const ast::IfStmt &node) const {
  auto originalBB = ctx.getCurBasicBlock();
  FunctionModule &func = ctx.getCurFunc();

  auto thenFirstBB = func.insertBBAfter(originalBB);
  auto thenFirstLabel = getBBLabel(thenFirstBB);
  ctx.setCurBasicBlock(thenFirstBB);
  visit(*node.then);
  auto thenLastBB = ctx.getCurBasicBlock();

  BBLIter elseFirstBB, elseLastBB;
  std::shared_ptr<Label> elseFirstLabel = nullptr;
  if (node.else_) {
    elseFirstBB = func.insertBBAfter(thenLastBB);
    elseFirstLabel = getBBLabel(elseFirstBB);
    ctx.setCurBasicBlock(elseFirstBB);
    visit(*node.else_);
    elseLastBB = ctx.getCurBasicBlock();
  }

  auto successorBB = func.insertBBAfter(node.else_ ? elseLastBB : thenLastBB);
  auto successorLabel = std::make_shared<Label>(successorBB->getLabelID());
  auto jump = std::make_shared<Jump>(successorLabel);
  if (!thenLastBB->isCompleted())
    ctx.appendInst(thenLastBB, jump);
  if (node.else_ && !elseLastBB->isCompleted())
    ctx.appendInst(elseLastBB, jump);

  auto &info = ctx.getLogicalExprInfo();
  info.inCondition = true;
  info.trueNext = thenFirstBB;
  info.falseNext = node.else_ ? elseFirstBB : successorBB;
  info.empty = false;
  ctx.setCurBasicBlock(originalBB);
  visit(*node.condition);
  info.empty = true;
  info.inCondition = false;

  ctx.setCurBasicBlock(successorBB);
}